

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io.h
# Opt level: O2

void format::load_mtx_csc_real(string *filename,CSC **A)

{
  read_file_error *this;
  char cVar1;
  allocator local_3a9;
  string local_3a8;
  string local_388 [11];
  ifstream fin;
  
  std::ifstream::ifstream(&fin,(string *)filename,_S_in);
  cVar1 = std::__basic_file<char>::is_open();
  if (cVar1 != '\0') {
    read_mtx_csc_real(&fin,A,false);
    std::ifstream::close();
    std::ifstream::~ifstream(&fin);
    return;
  }
  std::ifstream::close();
  this = (read_file_error *)__cxa_allocate_exception(0x30);
  std::__cxx11::string::string((string *)local_388,(string *)filename);
  std::__cxx11::string::string((string *)&local_3a8,"Failed to read file",&local_3a9);
  read_file_error::read_file_error(this,local_388,&local_3a8);
  __cxa_throw(this,&read_file_error::typeinfo,open_file_error::~open_file_error);
}

Assistant:

void load_mtx_csc_real(std::string &filename, CSC *&A) {
  std::ifstream fin(filename);
  if(fin.is_open()){
   try {
    read_mtx_csc_real(fin, A);
   } catch (const mtx_format_error& e) {
    throw mtx_format_error(e.expected_format(),
                           e.got_format(),
                           filename,
                           e.what());
   } catch (const mtx_arith_error& e) {
    throw mtx_arith_error(e.expected_arith(),
                          e.got_arith(),
                          filename,
                          e.what());
   } catch (const mtx_header_error& e) {
    throw mtx_header_error(filename, e.what());
   }
  } else {
   fin.close();
   throw read_file_error(filename);
  }
  fin.close();
 }